

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_scriptsig_p2pkh_from_der
              (uchar *pub_key,size_t pub_key_len,uchar *sig,size_t sig_len,uchar *bytes_out,
              size_t len,size_t *written)

{
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  int local_4c;
  int ret;
  size_t n;
  size_t len_local;
  uchar *bytes_out_local;
  size_t sig_len_local;
  uchar *sig_local;
  size_t pub_key_len_local;
  uchar *pub_key_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((((pub_key == (uchar *)0x0) || (_Var1 = is_pk_len(pub_key_len), !_Var1)) ||
      (sig == (uchar *)0x0)) ||
     (((sig_len == 0 || (0x49 < sig_len)) ||
      ((bytes_out == (uchar *)0x0 || (written == (size_t *)0x0)))))) {
    pub_key_local._4_4_ = -2;
  }
  else {
    sVar2 = script_get_push_size(pub_key_len);
    sVar3 = script_get_push_size(sig_len);
    if (len < sVar2 + sVar3) {
      pub_key_local._4_4_ = -2;
    }
    else {
      local_4c = wally_script_push_from_bytes(sig,sig_len,0,bytes_out,len,written);
      if (local_4c == 0) {
        sVar2 = *written;
        local_4c = wally_script_push_from_bytes
                             (pub_key,pub_key_len,0,bytes_out + sVar2,len - sVar2,written);
        if (local_4c == 0) {
          *written = sVar2 + *written;
        }
        else {
          wally_clear(bytes_out,sVar2);
        }
      }
      pub_key_local._4_4_ = local_4c;
    }
  }
  return pub_key_local._4_4_;
}

Assistant:

int wally_scriptsig_p2pkh_from_der(
    const unsigned char *pub_key, size_t pub_key_len,
    const unsigned char *sig, size_t sig_len,
    unsigned char *bytes_out, size_t len, size_t *written)
{
    size_t n;
    int ret;

    if (written)
        *written = 0;

    if (!pub_key || !is_pk_len(pub_key_len) ||
        !sig || !sig_len || sig_len > EC_SIGNATURE_DER_MAX_LEN + 1 ||
        !bytes_out || !written)
        return WALLY_EINVAL;

    if (len < script_get_push_size(pub_key_len) + script_get_push_size(sig_len))
        return WALLY_EINVAL;

    ret = wally_script_push_from_bytes(sig, sig_len, 0,
                                       bytes_out, len, written);
    if (ret == WALLY_OK) {
        n = *written;
        ret = wally_script_push_from_bytes(pub_key, pub_key_len, 0,
                                           bytes_out + n, len - n, written);
        if (ret == WALLY_OK) {
            *written += n;
        } else
            wally_clear(bytes_out, n);
    }
    return ret;
}